

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_decoder.c
# Opt level: O1

lzma_ret lzma2_decoder_init(lzma_lz_decoder_conflict *lz,lzma_allocator *allocator,void *opt,
                           lzma_lz_options *lz_options)

{
  lzma_ret lVar1;
  lzma_coder_conflict6 *plVar2;
  _Bool _Var3;
  
  if (lz->coder == (lzma_coder_conflict6 *)0x0) {
    plVar2 = (lzma_coder_conflict6 *)lzma_alloc(0xb8,allocator);
    lz->coder = plVar2;
    if (plVar2 == (lzma_coder_conflict6 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    lz->code = lzma2_decode;
    lz->end = lzma2_decoder_end;
    (plVar2->lzma).reset = (_func_void_lzma_coder_ptr_void_ptr_conflict *)0x0;
    (plVar2->lzma).set_uncompressed = (_func_void_lzma_coder_ptr_lzma_vli_conflict *)0x0;
    (plVar2->lzma).coder = (lzma_coder_conflict6 *)0x0;
    (plVar2->lzma).code =
         (_func_lzma_ret_lzma_coder_ptr_lzma_dict_ptr_uint8_t_ptr_size_t_ptr_size_t_conflict *)0x0;
    (plVar2->lzma).end = (_func_void_lzma_coder_ptr_lzma_allocator_ptr_conflict4 *)0x0;
  }
  plVar2 = lz->coder;
  plVar2->sequence = SEQ_CONTROL;
  plVar2->need_properties = true;
  if (*(long *)((long)opt + 8) == 0) {
    _Var3 = true;
  }
  else {
    _Var3 = *(int *)((long)opt + 0x10) == 0;
  }
  plVar2->need_dictionary_reset = _Var3;
  lVar1 = lzma_lzma_decoder_create
                    ((lzma_lz_decoder_conflict1 *)&plVar2->lzma,allocator,opt,lz_options);
  return lVar1;
}

Assistant:

static lzma_ret
lzma2_decoder_init(lzma_lz_decoder *lz, lzma_allocator *allocator,
		const void *opt, lzma_lz_options *lz_options)
{
	const lzma_options_lzma *options = opt;

	if (lz->coder == NULL) {
		lz->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (lz->coder == NULL)
			return LZMA_MEM_ERROR;

		lz->code = &lzma2_decode;
		lz->end = &lzma2_decoder_end;

		lz->coder->lzma = LZMA_LZ_DECODER_INIT;
	}

	lz->coder->sequence = SEQ_CONTROL;
	lz->coder->need_properties = true;
	lz->coder->need_dictionary_reset = options->preset_dict == NULL
			|| options->preset_dict_size == 0;

	return lzma_lzma_decoder_create(&lz->coder->lzma,
			allocator, options, lz_options);
}